

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

char * idToShortDescription(PolicyID id)

{
  char *pcStack_10;
  PolicyID id_local;
  
  switch(id) {
  case CMP0000:
    pcStack_10 = "A minimum required CMake version must be specified.";
    break;
  case CMP0001:
    pcStack_10 = "CMAKE_BACKWARDS_COMPATIBILITY should no longer be used.";
    break;
  case CMP0002:
    pcStack_10 = "Logical target names must be globally unique.";
    break;
  case CMP0003:
    pcStack_10 = "Libraries linked via full path no longer produce linker search paths.";
    break;
  case CMP0004:
    pcStack_10 = "Libraries linked may not have leading or trailing whitespace.";
    break;
  case CMP0005:
    pcStack_10 = "Preprocessor definition values are now escaped automatically.";
    break;
  case CMP0006:
    pcStack_10 = "Installing MACOSX_BUNDLE targets requires a BUNDLE DESTINATION.";
    break;
  case CMP0007:
    pcStack_10 = "list command no longer ignores empty elements.";
    break;
  case CMP0008:
    pcStack_10 = "Libraries linked by full-path must have a valid library file name.";
    break;
  case CMP0009:
    pcStack_10 = "FILE GLOB_RECURSE calls should not follow symlinks by default.";
    break;
  case CMP0010:
    pcStack_10 = "Bad variable reference syntax is an error.";
    break;
  case CMP0011:
    pcStack_10 = "Included scripts do automatic cmake_policy PUSH and POP.";
    break;
  case CMP0012:
    pcStack_10 = "if() recognizes numbers and boolean constants.";
    break;
  case CMP0013:
    pcStack_10 = "Duplicate binary directories are not allowed.";
    break;
  case CMP0014:
    pcStack_10 = "Input directories must have CMakeLists.txt.";
    break;
  case CMP0015:
    pcStack_10 = "link_directories() treats paths relative to the source dir.";
    break;
  case CMP0016:
    pcStack_10 = "target_link_libraries() reports error if its only argument is not a target.";
    break;
  case CMP0017:
    pcStack_10 = "Prefer files from the CMake module directory when including from there.";
    break;
  case CMP0018:
    pcStack_10 = "Ignore CMAKE_SHARED_LIBRARY_<Lang>_FLAGS variable.";
    break;
  case CMP0019:
    pcStack_10 = "Do not re-expand variables in include and link information.";
    break;
  case CMP0020:
    pcStack_10 = "Automatically link Qt executables to qtmain target on Windows.";
    break;
  case CMP0021:
    pcStack_10 = "Fatal error on relative paths in INCLUDE_DIRECTORIES target property.";
    break;
  case CMP0022:
    pcStack_10 = "INTERFACE_LINK_LIBRARIES defines the link interface.";
    break;
  case CMP0023:
    pcStack_10 = "Plain and keyword target_link_libraries signatures cannot be mixed.";
    break;
  case CMP0024:
    pcStack_10 = "Disallow include export result.";
    break;
  case CMP0025:
    pcStack_10 = "Compiler id for Apple Clang is now AppleClang.";
    break;
  case CMP0026:
    pcStack_10 = "Disallow use of the LOCATION target property.";
    break;
  case CMP0027:
    pcStack_10 = "Conditionally linked imported targets with missing include directories.";
    break;
  case CMP0028:
    pcStack_10 = "Double colon in target name means ALIAS or IMPORTED target.";
    break;
  case CMP0029:
    pcStack_10 = "The subdir_depends command should not be called.";
    break;
  case CMP0030:
    pcStack_10 = "The use_mangled_mesa command should not be called.";
    break;
  case CMP0031:
    pcStack_10 = "The load_command command should not be called.";
    break;
  case CMP0032:
    pcStack_10 = "The output_required_files command should not be called.";
    break;
  case CMP0033:
    pcStack_10 = "The export_library_dependencies command should not be called.";
    break;
  case CMP0034:
    pcStack_10 = "The utility_source command should not be called.";
    break;
  case CMP0035:
    pcStack_10 = "The variable_requires command should not be called.";
    break;
  case CMP0036:
    pcStack_10 = "The build_name command should not be called.";
    break;
  case CMP0037:
    pcStack_10 = "Target names should not be reserved and should match a validity pattern.";
    break;
  case CMP0038:
    pcStack_10 = "Targets may not link directly to themselves.";
    break;
  case CMP0039:
    pcStack_10 = "Utility targets may not have link dependencies.";
    break;
  case CMP0040:
    pcStack_10 = "The target in the TARGET signature of add_custom_command() must exist.";
    break;
  case CMP0041:
    pcStack_10 = "Error on relative include with generator expression.";
    break;
  case CMP0042:
    pcStack_10 = "MACOSX_RPATH is enabled by default.";
    break;
  case CMP0043:
    pcStack_10 = "Ignore COMPILE_DEFINITIONS_<Config> properties.";
    break;
  case CMP0044:
    pcStack_10 = "Case sensitive <LANG>_COMPILER_ID generator expressions.";
    break;
  case CMP0045:
    pcStack_10 = "Error on non-existent target in get_target_property.";
    break;
  case CMP0046:
    pcStack_10 = "Error on non-existent dependency in add_dependencies.";
    break;
  case CMP0047:
    pcStack_10 = "Use QCC compiler id for the qcc drivers on QNX.";
    break;
  case CMP0048:
    pcStack_10 = "project() command manages VERSION variables.";
    break;
  case CMP0049:
    pcStack_10 = "Do not expand variables in target source entries.";
    break;
  case CMP0050:
    pcStack_10 = "Disallow add_custom_command SOURCE signatures.";
    break;
  case CMP0051:
    pcStack_10 = "List TARGET_OBJECTS in SOURCES target property.";
    break;
  case CMP0052:
    pcStack_10 = "Reject source and build dirs in installed INTERFACE_INCLUDE_DIRECTORIES.";
    break;
  case CMP0053:
    pcStack_10 = "Simplify variable reference and escape sequence evaluation.";
    break;
  case CMP0054:
    pcStack_10 = "Only interpret if() arguments as variables or keywords when unquoted.";
    break;
  case CMP0055:
    pcStack_10 = "Strict checking for break() command.";
    break;
  case CMP0056:
    pcStack_10 = "Honor link flags in try_compile() source-file signature.";
    break;
  case CMP0057:
    pcStack_10 = "Support new IN_LIST if() operator.";
    break;
  case CMP0058:
    pcStack_10 = "Ninja requires custom command byproducts to be explicit.";
    break;
  case CMP0059:
    pcStack_10 = "Do no treat DEFINITIONS as a built-in directory property.";
    break;
  case CMP0060:
    pcStack_10 = "Link libraries by full path even in implicit directories.";
    break;
  case CMP0061:
    pcStack_10 = "CTest does not by default tell make to ignore errors (-i).";
    break;
  case CMP0062:
    pcStack_10 = "Disallow install() of export() result.";
    break;
  case CMP0063:
    pcStack_10 = "Honor visibility properties for all target types.";
    break;
  case CMPCOUNT:
    pcStack_10 = (char *)0x0;
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* idToShortDescription(cmPolicies::PolicyID id)
{
  switch(id)
    {
#define POLICY_CASE(ID, SHORT_DESCRIPTION) \
    case cmPolicies::ID: \
      return SHORT_DESCRIPTION;
  CM_FOR_EACH_POLICY_ID_DOC(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return 0;
    }
  return 0;
}